

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

jx9_int64 UnixFile_Read(void *pUserData,void *pBuffer,jx9_int64 nDatatoRead)

{
  jx9_int64 jVar1;
  
  jVar1 = read((int)pUserData,pBuffer,nDatatoRead);
  if (jVar1 < 1) {
    jVar1 = -1;
  }
  return jVar1;
}

Assistant:

static jx9_int64 UnixFile_Read(void *pUserData, void *pBuffer, jx9_int64 nDatatoRead)
{
	ssize_t nRd;
	nRd = read(SX_PTR_TO_INT(pUserData), pBuffer, (size_t)nDatatoRead);
	if( nRd < 1 ){
		/* EOF or IO error */
		return -1;
	}
	return (jx9_int64)nRd;
}